

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack1to8.h
# Opt level: O0

void ncnn::deconvolution_pack1to8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  long *plVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  int iVar66;
  int iVar67;
  undefined8 *puVar68;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _w;
  __m256 _val;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_4;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  __m256 y_3;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  float local_4280;
  float fStack_427c;
  float fStack_4278;
  float fStack_4274;
  float fStack_4270;
  float fStack_426c;
  float fStack_4268;
  float fStack_4264;
  int local_423c;
  int local_4224;
  int local_41d4;
  long local_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  int local_414c;
  int local_4148;
  undefined1 (*local_40d8) [32];
  int local_40cc;
  float local_3da0;
  float fStack_3d9c;
  float fStack_3d98;
  float fStack_3d94;
  float fStack_3d90;
  float fStack_3d8c;
  float fStack_3d88;
  float fStack_3d84;
  undefined1 local_3ca0 [8];
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  ulong uStack_3c78;
  float local_3c00;
  float fStack_3bfc;
  float fStack_3bf8;
  float fStack_3bf4;
  float fStack_3bf0;
  float fStack_3bec;
  float fStack_3be8;
  float local_3a60;
  float fStack_3a5c;
  float fStack_3a58;
  float fStack_3a54;
  float fStack_3a50;
  float fStack_3a4c;
  float fStack_3a48;
  float fStack_3a44;
  float local_3a40;
  float fStack_3a3c;
  float fStack_3a38;
  float fStack_3a34;
  float fStack_3a30;
  float fStack_3a2c;
  float fStack_3a28;
  float local_3a20;
  float fStack_3a1c;
  float fStack_3a18;
  float fStack_3a14;
  float fStack_3a10;
  float fStack_3a0c;
  float fStack_3a08;
  float fStack_3a04;
  ulong uStack_38d8;
  float local_38a0;
  float fStack_389c;
  float fStack_3898;
  float fStack_3894;
  float fStack_3890;
  float fStack_388c;
  float fStack_3888;
  float fStack_3884;
  float local_3840;
  float fStack_383c;
  float fStack_3838;
  float fStack_3834;
  float fStack_3830;
  float fStack_382c;
  float fStack_3828;
  float fStack_3824;
  float local_3800;
  float fStack_37fc;
  float fStack_37f8;
  float fStack_37f4;
  float fStack_37f0;
  float fStack_37ec;
  float fStack_37e8;
  float local_37e0;
  float fStack_37dc;
  float fStack_37d8;
  float fStack_37d4;
  float fStack_37d0;
  float fStack_37cc;
  float fStack_37c8;
  undefined4 uStack_37c4;
  undefined1 local_3780 [8];
  float fStack_3778;
  float fStack_3774;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  float local_36e0;
  float fStack_36dc;
  float fStack_36d8;
  float fStack_36d4;
  float fStack_36d0;
  float fStack_36cc;
  float fStack_36c8;
  float fStack_36c4;
  float local_36a0;
  float fStack_369c;
  float fStack_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  float fStack_3688;
  float fStack_3684;
  float local_3640;
  float fStack_363c;
  float fStack_3638;
  float fStack_3634;
  float fStack_3630;
  float fStack_362c;
  float fStack_3628;
  undefined4 uStack_3624;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined1 local_3260 [8];
  float fStack_3258;
  float fStack_3254;
  float fStack_3250;
  float fStack_324c;
  float fStack_3248;
  undefined4 uStack_3244;
  undefined1 local_3220 [16];
  float local_2ee0;
  float fStack_2edc;
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  float local_2d40;
  float fStack_2d3c;
  float fStack_2d38;
  float fStack_2d34;
  float fStack_2d30;
  float fStack_2d2c;
  float fStack_2d28;
  float local_2ce0;
  float fStack_2cdc;
  float fStack_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  float fStack_2cc8;
  float fStack_2cc4;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined1 local_2ba0 [8];
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  undefined4 uStack_2b84;
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  float local_2360;
  float fStack_235c;
  float fStack_2358;
  float fStack_2354;
  float fStack_2350;
  float fStack_234c;
  float fStack_2348;
  float fStack_2344;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float fStack_2204;
  float local_1c40;
  float fStack_1c3c;
  float fStack_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float fStack_1c28;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float local_1c00;
  float fStack_1bfc;
  float fStack_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float fStack_1bec;
  float fStack_1be8;
  undefined4 uStack_1be4;
  float local_1b40;
  float fStack_1b3c;
  float fStack_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  float fStack_1b28;
  float fStack_1b24;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined1 local_1960 [8];
  float fStack_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float fStack_1948;
  undefined4 uStack_1944;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined1 local_e80 [8];
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  undefined1 local_e00 [8];
  float fStack_df8;
  float fStack_df4;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined1 local_d80 [8];
  float fStack_d78;
  float fStack_d74;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined8 local_160;
  undefined8 uStack_158;
  
  lVar62 = in_RSI[7];
  lVar4 = *in_RCX;
  for (local_40cc = 0; local_40cc < (int)lVar62; local_40cc = local_40cc + 1) {
    local_40d8 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_40cc * in_RSI[2]);
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    lVar63 = in_RDI[6];
    lVar64 = in_RDI[7];
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    lVar65 = in_RSI[6];
    for (local_4148 = 0; local_4148 < (int)lVar65; local_4148 = local_4148 + 1) {
      for (local_414c = 0; local_414c < iVar3; local_414c = local_414c + 1) {
        local_4180 = 0;
        uStack_4178 = 0;
        uStack_4170 = 0;
        uStack_4168 = 0;
        if (lVar4 != 0) {
          puVar68 = (undefined8 *)(lVar4 + (long)(local_40cc << 3) * 4);
          local_4180 = *puVar68;
          uStack_4178 = puVar68[1];
          uStack_4170 = puVar68[2];
          uStack_4168 = puVar68[3];
        }
        local_4188 = *in_RDX + in_RDX[8] * (long)local_40cc * in_RDX[2];
        for (local_41d4 = 0; local_41d4 < (int)lVar64; local_41d4 = local_41d4 + 1) {
          for (local_4224 = 0; local_4224 < in_R9D; local_4224 = local_4224 + 1) {
            iVar66 = (local_4148 + local_4224 * dilation_w) - dilation_w * (in_R9D + -1);
            if (((-1 < iVar66) && (iVar66 % stride_w == 0)) && (iVar66 / stride_w < (int)lVar63)) {
              for (local_423c = 0; local_423c < in_R8D; local_423c = local_423c + 1) {
                iVar67 = (local_414c + local_423c * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar67) && (iVar67 % dilation_h == 0)) && (iVar67 / dilation_h < iVar2))
                {
                  uVar1 = *(uint *)(*in_RDI + in_RDI[8] * (long)local_41d4 * in_RDI[2] +
                                    (long)*(int *)((long)in_RDI + 0x2c) * (long)(iVar66 / stride_w)
                                    * in_RDI[2] + (long)(iVar67 / dilation_h) * 4);
                  auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
                  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
                  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
                  auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
                  auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
                  auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
                  puVar68 = (undefined8 *)
                            (local_4188 + (long)((local_4224 * in_R8D + local_423c) * 8) * 4);
                  local_4280 = auVar6._0_4_;
                  fStack_427c = auVar6._4_4_;
                  fStack_4278 = auVar6._8_4_;
                  fStack_4274 = auVar6._12_4_;
                  fStack_4270 = auVar5._0_4_;
                  fStack_426c = auVar5._4_4_;
                  fStack_4268 = auVar5._8_4_;
                  fStack_4264 = auVar5._12_4_;
                  local_3c00 = (float)*puVar68;
                  fStack_3bfc = (float)((ulong)*puVar68 >> 0x20);
                  fStack_3bf8 = (float)puVar68[1];
                  fStack_3bf4 = (float)((ulong)puVar68[1] >> 0x20);
                  fStack_3bf0 = (float)puVar68[2];
                  fStack_3bec = (float)((ulong)puVar68[2] >> 0x20);
                  fStack_3be8 = (float)puVar68[3];
                  local_3da0 = (float)local_4180;
                  fStack_3d9c = (float)((ulong)local_4180 >> 0x20);
                  fStack_3d98 = (float)uStack_4178;
                  fStack_3d94 = (float)((ulong)uStack_4178 >> 0x20);
                  fStack_3d90 = (float)uStack_4170;
                  fStack_3d8c = (float)((ulong)uStack_4170 >> 0x20);
                  fStack_3d88 = (float)uStack_4168;
                  fStack_3d84 = (float)((ulong)uStack_4168 >> 0x20);
                  local_4180 = CONCAT44(fStack_427c * fStack_3bfc + fStack_3d9c,
                                        local_4280 * local_3c00 + local_3da0);
                  uStack_4178 = CONCAT44(fStack_4274 * fStack_3bf4 + fStack_3d94,
                                         fStack_4278 * fStack_3bf8 + fStack_3d98);
                  uStack_4170 = CONCAT44(fStack_426c * fStack_3bec + fStack_3d8c,
                                         fStack_4270 * fStack_3bf0 + fStack_3d90);
                  uStack_4168 = CONCAT44(fStack_4264 + fStack_3d84,
                                         fStack_4268 * fStack_3be8 + fStack_3d88);
                }
              }
            }
          }
          local_4188 = local_4188 + (long)(in_R8D * in_R9D * 8) * 4;
        }
        plVar15 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_37e0 = (float)local_4180;
        fStack_37dc = (float)((ulong)local_4180 >> 0x20);
        fStack_37d8 = (float)uStack_4178;
        fStack_37d4 = (float)((ulong)uStack_4178 >> 0x20);
        fStack_37d0 = (float)uStack_4170;
        fStack_37cc = (float)((ulong)uStack_4170 >> 0x20);
        fStack_37c8 = (float)uStack_4168;
        switch(stride_h) {
        case 1:
          uStack_3c78 = SUB328(ZEXT832(0),4);
          auVar16._8_8_ = uStack_4178;
          auVar16._0_8_ = local_4180;
          auVar16._16_8_ = uStack_4170;
          auVar16._24_8_ = uStack_4168;
          _local_3ca0 = vmaxps_avx(auVar16,ZEXT832(uStack_3c78) << 0x40);
          break;
        case 2:
          uVar1 = *(uint *)*plVar15;
          auVar19._8_8_ = uStack_4178;
          auVar19._0_8_ = local_4180;
          auVar19._16_8_ = uStack_4170;
          auVar19._24_8_ = uStack_4168;
          auVar12 = vmaxps_avx(ZEXT832(0),auVar19);
          auVar20._8_8_ = uStack_4178;
          auVar20._0_8_ = local_4180;
          auVar20._16_8_ = uStack_4170;
          auVar20._24_8_ = uStack_4168;
          auVar11 = vminps_avx(ZEXT832(0),auVar20);
          auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
          auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
          local_3a20 = auVar6._0_4_;
          fStack_3a1c = auVar6._4_4_;
          fStack_3a18 = auVar6._8_4_;
          fStack_3a14 = auVar6._12_4_;
          fStack_3a10 = auVar5._0_4_;
          fStack_3a0c = auVar5._4_4_;
          fStack_3a08 = auVar5._8_4_;
          fStack_3a04 = auVar5._12_4_;
          local_3a40 = auVar11._0_4_;
          fStack_3a3c = auVar11._4_4_;
          fStack_3a38 = auVar11._8_4_;
          fStack_3a34 = auVar11._12_4_;
          fStack_3a30 = auVar11._16_4_;
          fStack_3a2c = auVar11._20_4_;
          fStack_3a28 = auVar11._24_4_;
          local_3a60 = auVar12._0_4_;
          fStack_3a5c = auVar12._4_4_;
          fStack_3a58 = auVar12._8_4_;
          fStack_3a54 = auVar12._12_4_;
          fStack_3a50 = auVar12._16_4_;
          fStack_3a4c = auVar12._20_4_;
          fStack_3a48 = auVar12._24_4_;
          fStack_3a44 = auVar12._28_4_;
          local_3ca0._4_4_ = fStack_3a5c + fStack_3a1c * fStack_3a3c;
          local_3ca0._0_4_ = local_3a60 + local_3a20 * local_3a40;
          uStack_3c98._0_4_ = fStack_3a58 + fStack_3a18 * fStack_3a38;
          uStack_3c98._4_4_ = fStack_3a54 + fStack_3a14 * fStack_3a34;
          uStack_3c90._0_4_ = fStack_3a50 + fStack_3a10 * fStack_3a30;
          uStack_3c90._4_4_ = fStack_3a4c + fStack_3a0c * fStack_3a2c;
          uStack_3c88._0_4_ = fStack_3a48 + fStack_3a08 * fStack_3a28;
          uStack_3c88._4_4_ = fStack_3a44 + fStack_3a04;
          break;
        case 3:
          uVar1 = *(uint *)*plVar15;
          auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
          auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
          uStack_33f0 = auVar6._0_8_;
          uStack_33e8 = auVar6._8_8_;
          uVar1 = *(uint *)(*plVar15 + 4);
          auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
          auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
          uStack_33b0 = auVar6._0_8_;
          uStack_33a8 = auVar6._8_8_;
          auVar18._8_8_ = uStack_4178;
          auVar18._0_8_ = local_4180;
          auVar18._16_8_ = uStack_4170;
          auVar18._24_8_ = uStack_4168;
          auVar17._16_8_ = uStack_33f0;
          auVar17._0_16_ = auVar5;
          auVar17._24_8_ = uStack_33e8;
          auVar12 = vmaxps_avx(auVar18,auVar17);
          auVar21._16_8_ = uStack_33b0;
          auVar21._0_16_ = auVar7;
          auVar21._24_8_ = uStack_33a8;
          _local_3ca0 = vminps_avx(auVar12,auVar21);
          break;
        case 4:
          auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          uStack_34f0 = auVar6._0_8_;
          uStack_34e8 = auVar6._8_8_;
          uStack_38d8 = SUB328(ZEXT832(0),4);
          auVar27._8_8_ = uStack_4178;
          auVar27._0_8_ = local_4180;
          auVar27._16_8_ = uStack_4170;
          auVar27._24_8_ = uStack_4168;
          auVar12 = vsubps_avx(ZEXT832(uStack_38d8) << 0x40,auVar27);
          auVar26._8_8_ = 0x42b0c0a542b0c0a5;
          auVar26._0_8_ = 0x42b0c0a542b0c0a5;
          auVar26._16_8_ = 0x42b0c0a542b0c0a5;
          auVar26._24_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar12,auVar26);
          auVar25._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar25._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar25._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar25._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar25);
          local_2820 = auVar11._0_4_;
          fStack_281c = auVar11._4_4_;
          fStack_2818 = auVar11._8_4_;
          fStack_2814 = auVar11._12_4_;
          fStack_2810 = auVar11._16_4_;
          fStack_280c = auVar11._20_4_;
          fStack_2808 = auVar11._24_4_;
          local_2ba0._4_4_ = fStack_281c * 1.442695 + 0.5;
          local_2ba0._0_4_ = local_2820 * 1.442695 + 0.5;
          fStack_2b98 = fStack_2818 * 1.442695 + 0.5;
          fStack_2b94 = fStack_2814 * 1.442695 + 0.5;
          fStack_2b90 = fStack_2810 * 1.442695 + 0.5;
          fStack_2b8c = fStack_280c * 1.442695 + 0.5;
          fStack_2b88 = fStack_2808 * 1.442695 + 0.5;
          uStack_2b84 = 0x3ff8aa3b;
          auVar14 = vroundps_avx(_local_2ba0,1);
          auVar12 = vcmpps_avx(_local_2ba0,auVar14,1);
          auVar28._8_8_ = 0x3f8000003f800000;
          auVar28._0_8_ = 0x3f8000003f800000;
          auVar28._16_8_ = 0x3f8000003f800000;
          auVar28._24_8_ = 0x3f8000003f800000;
          auVar12 = vandps_avx(auVar12,auVar28);
          auVar12 = vsubps_avx(auVar14,auVar12);
          local_2360 = auVar12._0_4_;
          fStack_235c = auVar12._4_4_;
          fStack_2358 = auVar12._8_4_;
          fStack_2354 = auVar12._12_4_;
          fStack_2350 = auVar12._16_4_;
          fStack_234c = auVar12._20_4_;
          fStack_2348 = auVar12._24_4_;
          fStack_2344 = auVar12._28_4_;
          auVar31._4_4_ = fStack_235c * 0.6933594;
          auVar31._0_4_ = local_2360 * 0.6933594;
          auVar31._8_4_ = fStack_2358 * 0.6933594;
          auVar31._12_4_ = fStack_2354 * 0.6933594;
          auVar31._16_4_ = fStack_2350 * 0.6933594;
          auVar31._20_4_ = fStack_234c * 0.6933594;
          auVar31._24_4_ = fStack_2348 * 0.6933594;
          auVar31._28_4_ = fStack_2344;
          auVar12 = vsubps_avx(auVar11,auVar31);
          auVar30._4_4_ = fStack_235c * -0.00021219444;
          auVar30._0_4_ = local_2360 * -0.00021219444;
          auVar30._8_4_ = fStack_2358 * -0.00021219444;
          auVar30._12_4_ = fStack_2354 * -0.00021219444;
          auVar30._16_4_ = fStack_2350 * -0.00021219444;
          auVar30._20_4_ = fStack_234c * -0.00021219444;
          auVar30._24_4_ = fStack_2348 * -0.00021219444;
          auVar30._28_4_ = fStack_2344;
          auVar12 = vsubps_avx(auVar12,auVar30);
          local_2620 = auVar12._0_4_;
          fStack_261c = auVar12._4_4_;
          fStack_2618 = auVar12._8_4_;
          fStack_2614 = auVar12._12_4_;
          fStack_2610 = auVar12._16_4_;
          fStack_260c = auVar12._20_4_;
          fStack_2608 = auVar12._24_4_;
          fStack_2604 = auVar12._28_4_;
          local_2bc0 = CONCAT44((int)fStack_235c,(int)local_2360);
          uStack_2bb8 = CONCAT44((int)fStack_2354,(int)fStack_2358);
          uStack_2bb0 = CONCAT44((int)fStack_234c,(int)fStack_2350);
          uStack_2ba8 = CONCAT44((int)fStack_2344,(int)fStack_2348);
          auVar37._8_8_ = uStack_2bb8;
          auVar37._0_8_ = local_2bc0;
          auVar36._8_8_ = 0x7f0000007f;
          auVar36._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar37,auVar36);
          auVar35._8_8_ = uStack_2ba8;
          auVar35._0_8_ = uStack_2bb0;
          auVar34._8_8_ = 0x7f0000007f;
          auVar34._0_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx(auVar35,auVar34);
          auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
          auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
          local_2680 = auVar7._0_4_;
          fStack_267c = auVar7._4_4_;
          fStack_2678 = auVar7._8_4_;
          fStack_2674 = auVar7._12_4_;
          fStack_2670 = auVar8._0_4_;
          fStack_266c = auVar8._4_4_;
          fStack_2668 = auVar8._8_4_;
          local_38a0 = auVar5._0_4_;
          fStack_389c = auVar5._4_4_;
          fStack_3898 = auVar5._8_4_;
          fStack_3894 = auVar5._12_4_;
          fStack_3890 = auVar6._0_4_;
          fStack_388c = auVar6._4_4_;
          fStack_3888 = auVar6._8_4_;
          fStack_3884 = auVar6._12_4_;
          auVar23._16_8_ = uStack_34f0;
          auVar23._0_16_ = auVar5;
          auVar23._24_8_ = uStack_34e8;
          auVar22._4_4_ =
               fStack_389c +
               ((((((fStack_261c * 0.00019875691 + 0.0013981999) * fStack_261c + 0.008333452) *
                   fStack_261c + 0.041665796) * fStack_261c + 0.16666666) * fStack_261c + 0.5) *
                fStack_261c * fStack_261c + fStack_261c + 1.0) * fStack_267c;
          auVar22._0_4_ =
               local_38a0 +
               ((((((local_2620 * 0.00019875691 + 0.0013981999) * local_2620 + 0.008333452) *
                   local_2620 + 0.041665796) * local_2620 + 0.16666666) * local_2620 + 0.5) *
                local_2620 * local_2620 + local_2620 + 1.0) * local_2680;
          auVar22._8_4_ =
               fStack_3898 +
               ((((((fStack_2618 * 0.00019875691 + 0.0013981999) * fStack_2618 + 0.008333452) *
                   fStack_2618 + 0.041665796) * fStack_2618 + 0.16666666) * fStack_2618 + 0.5) *
                fStack_2618 * fStack_2618 + fStack_2618 + 1.0) * fStack_2678;
          auVar22._12_4_ =
               fStack_3894 +
               ((((((fStack_2614 * 0.00019875691 + 0.0013981999) * fStack_2614 + 0.008333452) *
                   fStack_2614 + 0.041665796) * fStack_2614 + 0.16666666) * fStack_2614 + 0.5) *
                fStack_2614 * fStack_2614 + fStack_2614 + 1.0) * fStack_2674;
          auVar22._16_4_ =
               fStack_3890 +
               ((((((fStack_2610 * 0.00019875691 + 0.0013981999) * fStack_2610 + 0.008333452) *
                   fStack_2610 + 0.041665796) * fStack_2610 + 0.16666666) * fStack_2610 + 0.5) *
                fStack_2610 * fStack_2610 + fStack_2610 + 1.0) * fStack_2670;
          auVar22._20_4_ =
               fStack_388c +
               ((((((fStack_260c * 0.00019875691 + 0.0013981999) * fStack_260c + 0.008333452) *
                   fStack_260c + 0.041665796) * fStack_260c + 0.16666666) * fStack_260c + 0.5) *
                fStack_260c * fStack_260c + fStack_260c + 1.0) * fStack_266c;
          auVar22._24_4_ =
               fStack_3888 +
               ((((((fStack_2608 * 0.00019875691 + 0.0013981999) * fStack_2608 + 0.008333452) *
                   fStack_2608 + 0.041665796) * fStack_2608 + 0.16666666) * fStack_2608 + 0.5) *
                fStack_2608 * fStack_2608 + fStack_2608 + 1.0) * fStack_2668;
          auVar22._28_4_ = fStack_3884 + fStack_2604 + fStack_2604 + 1.0;
          _local_3ca0 = vdivps_avx(auVar23,auVar22);
          break;
        case 5:
          local_3220._8_8_ = uStack_4178;
          local_3220._0_8_ = local_4180;
          auVar24._16_8_ = uStack_4170;
          auVar24._0_16_ = local_3220;
          auVar24._24_8_ = uStack_4168;
          auVar13._8_8_ = 0x42b0c0a542b0c0a5;
          auVar13._0_8_ = 0x42b0c0a542b0c0a5;
          auVar13._16_8_ = 0x42b0c0a542b0c0a5;
          auVar13._24_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar24,auVar13);
          auVar14._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar14._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar14._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar14._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar14);
          local_2ee0 = auVar11._0_4_;
          fStack_2edc = auVar11._4_4_;
          fStack_2ed8 = auVar11._8_4_;
          fStack_2ed4 = auVar11._12_4_;
          fStack_2ed0 = auVar11._16_4_;
          fStack_2ecc = auVar11._20_4_;
          fStack_2ec8 = auVar11._24_4_;
          local_3260._4_4_ = fStack_2edc * 1.442695 + 0.5;
          local_3260._0_4_ = local_2ee0 * 1.442695 + 0.5;
          fStack_3258 = fStack_2ed8 * 1.442695 + 0.5;
          fStack_3254 = fStack_2ed4 * 1.442695 + 0.5;
          fStack_3250 = fStack_2ed0 * 1.442695 + 0.5;
          fStack_324c = fStack_2ecc * 1.442695 + 0.5;
          fStack_3248 = fStack_2ec8 * 1.442695 + 0.5;
          uStack_3244 = 0x3ff8aa3b;
          auVar14 = vroundps_avx(_local_3260,1);
          auVar12 = vcmpps_avx(_local_3260,auVar14,1);
          auVar29._8_8_ = 0x3f8000003f800000;
          auVar29._0_8_ = 0x3f8000003f800000;
          auVar29._16_8_ = 0x3f8000003f800000;
          auVar29._24_8_ = 0x3f8000003f800000;
          auVar12 = vandps_avx(auVar12,auVar29);
          auVar12 = vsubps_avx(auVar14,auVar12);
          local_2220 = auVar12._0_4_;
          fStack_221c = auVar12._4_4_;
          fStack_2218 = auVar12._8_4_;
          fStack_2214 = auVar12._12_4_;
          fStack_2210 = auVar12._16_4_;
          fStack_220c = auVar12._20_4_;
          fStack_2208 = auVar12._24_4_;
          fStack_2204 = auVar12._28_4_;
          auVar33._4_4_ = fStack_221c * 0.6933594;
          auVar33._0_4_ = local_2220 * 0.6933594;
          auVar33._8_4_ = fStack_2218 * 0.6933594;
          auVar33._12_4_ = fStack_2214 * 0.6933594;
          auVar33._16_4_ = fStack_2210 * 0.6933594;
          auVar33._20_4_ = fStack_220c * 0.6933594;
          auVar33._24_4_ = fStack_2208 * 0.6933594;
          auVar33._28_4_ = fStack_2204;
          auVar12 = vsubps_avx(auVar11,auVar33);
          auVar32._4_4_ = fStack_221c * -0.00021219444;
          auVar32._0_4_ = local_2220 * -0.00021219444;
          auVar32._8_4_ = fStack_2218 * -0.00021219444;
          auVar32._12_4_ = fStack_2214 * -0.00021219444;
          auVar32._16_4_ = fStack_2210 * -0.00021219444;
          auVar32._20_4_ = fStack_220c * -0.00021219444;
          auVar32._24_4_ = fStack_2208 * -0.00021219444;
          auVar32._28_4_ = fStack_2204;
          auVar12 = vsubps_avx(auVar12,auVar32);
          local_2ce0 = auVar12._0_4_;
          fStack_2cdc = auVar12._4_4_;
          fStack_2cd8 = auVar12._8_4_;
          fStack_2cd4 = auVar12._12_4_;
          fStack_2cd0 = auVar12._16_4_;
          fStack_2ccc = auVar12._20_4_;
          fStack_2cc8 = auVar12._24_4_;
          fStack_2cc4 = auVar12._28_4_;
          local_3280 = CONCAT44((int)fStack_221c,(int)local_2220);
          uStack_3278 = CONCAT44((int)fStack_2214,(int)fStack_2218);
          uStack_3270 = CONCAT44((int)fStack_220c,(int)fStack_2210);
          uStack_3268 = CONCAT44((int)fStack_2204,(int)fStack_2208);
          auVar8._8_8_ = uStack_3278;
          auVar8._0_8_ = local_3280;
          auVar5._8_8_ = 0x7f0000007f;
          auVar5._0_8_ = 0x7f0000007f;
          auVar5 = vpaddd_avx(auVar8,auVar5);
          auVar7._8_8_ = uStack_3268;
          auVar7._0_8_ = uStack_3270;
          auVar6._8_8_ = 0x7f0000007f;
          auVar6._0_8_ = 0x7f0000007f;
          auVar6 = vpaddd_avx(auVar7,auVar6);
          auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
          auVar6 = vpslld_avx(auVar6,ZEXT416(0x17));
          local_2d40 = auVar5._0_4_;
          fStack_2d3c = auVar5._4_4_;
          fStack_2d38 = auVar5._8_4_;
          fStack_2d34 = auVar5._12_4_;
          fStack_2d30 = auVar6._0_4_;
          fStack_2d2c = auVar6._4_4_;
          fStack_2d28 = auVar6._8_4_;
          auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          local_3840 = auVar5._0_4_;
          fStack_383c = auVar5._4_4_;
          fStack_3838 = auVar5._8_4_;
          fStack_3834 = auVar5._12_4_;
          fStack_3830 = auVar6._0_4_;
          fStack_382c = auVar6._4_4_;
          fStack_3828 = auVar6._8_4_;
          fStack_3824 = auVar6._12_4_;
          local_d80._4_4_ =
               ((((((fStack_2cdc * 0.00019875691 + 0.0013981999) * fStack_2cdc + 0.008333452) *
                   fStack_2cdc + 0.041665796) * fStack_2cdc + 0.16666666) * fStack_2cdc + 0.5) *
                fStack_2cdc * fStack_2cdc + fStack_2cdc + 1.0) * fStack_2d3c + fStack_383c;
          local_d80._0_4_ =
               ((((((local_2ce0 * 0.00019875691 + 0.0013981999) * local_2ce0 + 0.008333452) *
                   local_2ce0 + 0.041665796) * local_2ce0 + 0.16666666) * local_2ce0 + 0.5) *
                local_2ce0 * local_2ce0 + local_2ce0 + 1.0) * local_2d40 + local_3840;
          fStack_d78 = ((((((fStack_2cd8 * 0.00019875691 + 0.0013981999) * fStack_2cd8 + 0.008333452
                           ) * fStack_2cd8 + 0.041665796) * fStack_2cd8 + 0.16666666) * fStack_2cd8
                        + 0.5) * fStack_2cd8 * fStack_2cd8 + fStack_2cd8 + 1.0) * fStack_2d38 +
                       fStack_3838;
          fStack_d74 = ((((((fStack_2cd4 * 0.00019875691 + 0.0013981999) * fStack_2cd4 + 0.008333452
                           ) * fStack_2cd4 + 0.041665796) * fStack_2cd4 + 0.16666666) * fStack_2cd4
                        + 0.5) * fStack_2cd4 * fStack_2cd4 + fStack_2cd4 + 1.0) * fStack_2d34 +
                       fStack_3834;
          uStack_d70._0_4_ =
               ((((((fStack_2cd0 * 0.00019875691 + 0.0013981999) * fStack_2cd0 + 0.008333452) *
                   fStack_2cd0 + 0.041665796) * fStack_2cd0 + 0.16666666) * fStack_2cd0 + 0.5) *
                fStack_2cd0 * fStack_2cd0 + fStack_2cd0 + 1.0) * fStack_2d30 + fStack_3830;
          uStack_d70._4_4_ =
               ((((((fStack_2ccc * 0.00019875691 + 0.0013981999) * fStack_2ccc + 0.008333452) *
                   fStack_2ccc + 0.041665796) * fStack_2ccc + 0.16666666) * fStack_2ccc + 0.5) *
                fStack_2ccc * fStack_2ccc + fStack_2ccc + 1.0) * fStack_2d2c + fStack_382c;
          uStack_d68._0_4_ =
               ((((((fStack_2cc8 * 0.00019875691 + 0.0013981999) * fStack_2cc8 + 0.008333452) *
                   fStack_2cc8 + 0.041665796) * fStack_2cc8 + 0.16666666) * fStack_2cc8 + 0.5) *
                fStack_2cc8 * fStack_2cc8 + fStack_2cc8 + 1.0) * fStack_2d28 + fStack_3828;
          uStack_d68._4_4_ = fStack_2cc4 + fStack_2cc4 + 1.0 + fStack_3824;
          auVar12 = _local_d80;
          auVar14 = vcmpps_avx(_local_d80,ZEXT1632(ZEXT816(0) << 0x40),2);
          uStack_d68 = auVar12._24_8_;
          auVar51._16_8_ = uStack_d70;
          auVar51._0_16_ = _local_d80;
          auVar51._24_8_ = uStack_d68;
          auVar50._8_8_ = 0x80000000800000;
          auVar50._0_8_ = 0x80000000800000;
          auVar50._16_8_ = 0x80000000800000;
          auVar50._24_8_ = 0x80000000800000;
          auVar12 = vmaxps_avx(auVar51,auVar50);
          auVar5 = vpsrld_avx(auVar12._0_16_,ZEXT416(0x17));
          auVar6 = vpsrld_avx(auVar12._16_16_,ZEXT416(0x17));
          auVar55._8_8_ = 0x807fffff807fffff;
          auVar55._0_8_ = 0x807fffff807fffff;
          auVar55._16_8_ = 0x807fffff807fffff;
          auVar55._24_8_ = 0x807fffff807fffff;
          auVar12 = vandps_avx(auVar12,auVar55);
          auVar58._8_8_ = 0x3f0000003f000000;
          auVar58._0_8_ = 0x3f0000003f000000;
          auVar58._16_8_ = 0x3f0000003f000000;
          auVar58._24_8_ = 0x3f0000003f000000;
          auVar13 = vorps_avx(auVar12,auVar58);
          auVar61._8_8_ = 0x7f0000007f;
          auVar61._0_8_ = 0x7f0000007f;
          auVar5 = vpsubd_avx(auVar5,auVar61);
          auVar60._8_8_ = 0x7f0000007f;
          auVar60._0_8_ = 0x7f0000007f;
          auVar6 = vpsubd_avx(auVar6,auVar60);
          local_160 = auVar6._0_8_;
          uStack_158 = auVar6._8_8_;
          auVar59._16_8_ = local_160;
          auVar59._0_16_ = auVar5;
          auVar59._24_8_ = uStack_158;
          auVar12 = vcvtdq2ps_avx(auVar59);
          local_ca0 = auVar12._0_4_;
          fStack_c9c = auVar12._4_4_;
          fStack_c98 = auVar12._8_4_;
          fStack_c94 = auVar12._12_4_;
          fStack_c90 = auVar12._16_4_;
          fStack_c8c = auVar12._20_4_;
          fStack_c88 = auVar12._24_4_;
          fStack_c84 = auVar12._28_4_;
          local_e00._4_4_ = fStack_c9c + 1.0;
          local_e00._0_4_ = local_ca0 + 1.0;
          fStack_df8 = fStack_c98 + 1.0;
          fStack_df4 = fStack_c94 + 1.0;
          uStack_df0._0_4_ = fStack_c90 + 1.0;
          uStack_df0._4_4_ = fStack_c8c + 1.0;
          uStack_de8._0_4_ = fStack_c88 + 1.0;
          uStack_de8._4_4_ = fStack_c84 + 1.0;
          auVar24 = _local_e00;
          auVar11 = vcmpps_avx(auVar13,_DAT_01f92660,1);
          auVar12 = vandps_avx(auVar13,auVar11);
          auVar53._8_8_ = 0x3f8000003f800000;
          auVar53._0_8_ = 0x3f8000003f800000;
          auVar53._16_8_ = 0x3f8000003f800000;
          auVar53._24_8_ = 0x3f8000003f800000;
          auVar13 = vsubps_avx(auVar13,auVar53);
          uStack_de8 = auVar24._24_8_;
          auVar54._8_8_ = 0x3f8000003f800000;
          auVar54._0_8_ = 0x3f8000003f800000;
          auVar54._16_8_ = 0x3f8000003f800000;
          auVar54._24_8_ = 0x3f8000003f800000;
          auVar11 = vandps_avx(auVar11,auVar54);
          auVar52._16_8_ = uStack_df0;
          auVar52._0_16_ = _local_e00;
          auVar52._24_8_ = uStack_de8;
          auVar11 = vsubps_avx(auVar52,auVar11);
          local_ce0 = auVar13._0_4_;
          fStack_cdc = auVar13._4_4_;
          fStack_cd8 = auVar13._8_4_;
          fStack_cd4 = auVar13._12_4_;
          fStack_cd0 = auVar13._16_4_;
          fStack_ccc = auVar13._20_4_;
          fStack_cc8 = auVar13._24_4_;
          fStack_cc4 = auVar13._28_4_;
          local_d00 = auVar12._0_4_;
          fStack_cfc = auVar12._4_4_;
          fStack_cf8 = auVar12._8_4_;
          fStack_cf4 = auVar12._12_4_;
          fStack_cf0 = auVar12._16_4_;
          fStack_cec = auVar12._20_4_;
          fStack_ce8 = auVar12._24_4_;
          fStack_ce4 = auVar12._28_4_;
          local_ce0 = local_ce0 + local_d00;
          fStack_cdc = fStack_cdc + fStack_cfc;
          fStack_cd8 = fStack_cd8 + fStack_cf8;
          fStack_cd4 = fStack_cd4 + fStack_cf4;
          fStack_cd0 = fStack_cd0 + fStack_cf0;
          fStack_ccc = fStack_ccc + fStack_cec;
          fStack_cc8 = fStack_cc8 + fStack_ce8;
          fStack_cc4 = fStack_cc4 + fStack_ce4;
          local_6a0 = auVar11._0_4_;
          fStack_69c = auVar11._4_4_;
          fStack_698 = auVar11._8_4_;
          fStack_694 = auVar11._12_4_;
          fStack_690 = auVar11._16_4_;
          fStack_68c = auVar11._20_4_;
          fStack_688 = auVar11._24_4_;
          local_e80._4_4_ =
               fStack_69c * -0.00021219444 +
               ((((((((fStack_cdc * 0.070376836 + -0.1151461) * fStack_cdc + 0.116769984) *
                     fStack_cdc + -0.12420141) * fStack_cdc + 0.14249323) * fStack_cdc + -0.16668057
                  ) * fStack_cdc + 0.20000714) * fStack_cdc + -0.24999994) * fStack_cdc + 0.3333333)
               * fStack_cdc * fStack_cdc * fStack_cdc;
          local_e80._0_4_ =
               local_6a0 * -0.00021219444 +
               ((((((((local_ce0 * 0.070376836 + -0.1151461) * local_ce0 + 0.116769984) * local_ce0
                    + -0.12420141) * local_ce0 + 0.14249323) * local_ce0 + -0.16668057) * local_ce0
                 + 0.20000714) * local_ce0 + -0.24999994) * local_ce0 + 0.3333333) * local_ce0 *
               local_ce0 * local_ce0;
          fStack_e78 = fStack_698 * -0.00021219444 +
                       ((((((((fStack_cd8 * 0.070376836 + -0.1151461) * fStack_cd8 + 0.116769984) *
                             fStack_cd8 + -0.12420141) * fStack_cd8 + 0.14249323) * fStack_cd8 +
                          -0.16668057) * fStack_cd8 + 0.20000714) * fStack_cd8 + -0.24999994) *
                        fStack_cd8 + 0.3333333) * fStack_cd8 * fStack_cd8 * fStack_cd8;
          fStack_e74 = fStack_694 * -0.00021219444 +
                       ((((((((fStack_cd4 * 0.070376836 + -0.1151461) * fStack_cd4 + 0.116769984) *
                             fStack_cd4 + -0.12420141) * fStack_cd4 + 0.14249323) * fStack_cd4 +
                          -0.16668057) * fStack_cd4 + 0.20000714) * fStack_cd4 + -0.24999994) *
                        fStack_cd4 + 0.3333333) * fStack_cd4 * fStack_cd4 * fStack_cd4;
          fStack_e70 = fStack_690 * -0.00021219444 +
                       ((((((((fStack_cd0 * 0.070376836 + -0.1151461) * fStack_cd0 + 0.116769984) *
                             fStack_cd0 + -0.12420141) * fStack_cd0 + 0.14249323) * fStack_cd0 +
                          -0.16668057) * fStack_cd0 + 0.20000714) * fStack_cd0 + -0.24999994) *
                        fStack_cd0 + 0.3333333) * fStack_cd0 * fStack_cd0 * fStack_cd0;
          fStack_e6c = fStack_68c * -0.00021219444 +
                       ((((((((fStack_ccc * 0.070376836 + -0.1151461) * fStack_ccc + 0.116769984) *
                             fStack_ccc + -0.12420141) * fStack_ccc + 0.14249323) * fStack_ccc +
                          -0.16668057) * fStack_ccc + 0.20000714) * fStack_ccc + -0.24999994) *
                        fStack_ccc + 0.3333333) * fStack_ccc * fStack_ccc * fStack_ccc;
          fStack_e68 = fStack_688 * -0.00021219444 +
                       ((((((((fStack_cc8 * 0.070376836 + -0.1151461) * fStack_cc8 + 0.116769984) *
                             fStack_cc8 + -0.12420141) * fStack_cc8 + 0.14249323) * fStack_cc8 +
                          -0.16668057) * fStack_cc8 + 0.20000714) * fStack_cc8 + -0.24999994) *
                        fStack_cc8 + 0.3333333) * fStack_cc8 * fStack_cc8 * fStack_cc8;
          fStack_e64 = fStack_cc4 + 0.3333333 + -0.00021219444;
          auVar56._4_4_ = fStack_cdc * fStack_cdc * 0.5;
          auVar56._0_4_ = local_ce0 * local_ce0 * 0.5;
          auVar56._8_4_ = fStack_cd8 * fStack_cd8 * 0.5;
          auVar56._12_4_ = fStack_cd4 * fStack_cd4 * 0.5;
          auVar56._16_4_ = fStack_cd0 * fStack_cd0 * 0.5;
          auVar56._20_4_ = fStack_ccc * fStack_ccc * 0.5;
          auVar56._24_4_ = fStack_cc8 * fStack_cc8 * 0.5;
          auVar56._28_4_ = fStack_cc4;
          auVar12 = vsubps_avx(_local_e80,auVar56);
          local_d40 = auVar12._0_4_;
          fStack_d3c = auVar12._4_4_;
          fStack_d38 = auVar12._8_4_;
          fStack_d34 = auVar12._12_4_;
          fStack_d30 = auVar12._16_4_;
          fStack_d2c = auVar12._20_4_;
          fStack_d28 = auVar12._24_4_;
          fStack_d24 = auVar12._28_4_;
          local_d80._4_4_ = fStack_69c * 0.6933594 + fStack_cdc + fStack_d3c;
          local_d80._0_4_ = local_6a0 * 0.6933594 + local_ce0 + local_d40;
          fStack_d78 = fStack_698 * 0.6933594 + fStack_cd8 + fStack_d38;
          fStack_d74 = fStack_694 * 0.6933594 + fStack_cd4 + fStack_d34;
          uStack_d70._0_4_ = fStack_690 * 0.6933594 + fStack_cd0 + fStack_d30;
          uStack_d70._4_4_ = fStack_68c * 0.6933594 + fStack_ccc + fStack_d2c;
          uStack_d68._0_4_ = fStack_688 * 0.6933594 + fStack_cc8 + fStack_d28;
          uStack_d68._4_4_ = fStack_cc4 + fStack_d24 + 0.6933594;
          auVar12 = _local_d80;
          uStack_d68 = auVar12._24_8_;
          auVar57._16_8_ = uStack_d70;
          auVar57._0_16_ = _local_d80;
          auVar57._24_8_ = uStack_d68;
          auVar12 = vorps_avx(auVar57,auVar14);
          auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          uStack_1ab0 = auVar6._0_8_;
          uStack_1aa8 = auVar6._8_8_;
          auVar6 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x30);
          auVar7 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x30);
          local_1c00 = auVar12._0_4_;
          fStack_1bfc = auVar12._4_4_;
          fStack_1bf8 = auVar12._8_4_;
          fStack_1bf4 = auVar12._12_4_;
          fStack_1bf0 = auVar12._16_4_;
          fStack_1bec = auVar12._20_4_;
          fStack_1be8 = auVar12._24_4_;
          uStack_1be4 = auVar12._28_4_;
          local_1c20 = auVar6._0_4_;
          fStack_1c1c = auVar6._4_4_;
          fStack_1c18 = auVar6._8_4_;
          fStack_1c14 = auVar6._12_4_;
          fStack_1c10 = auVar7._0_4_;
          fStack_1c0c = auVar7._4_4_;
          fStack_1c08 = auVar7._8_4_;
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
          uStack_1af0 = auVar7._0_8_;
          uStack_1ae8 = auVar7._8_8_;
          auVar42._4_4_ = fStack_1bfc * fStack_1c1c;
          auVar42._0_4_ = local_1c00 * local_1c20;
          auVar42._12_4_ = fStack_1bf4 * fStack_1c14;
          auVar42._8_4_ = fStack_1bf8 * fStack_1c18;
          auVar42._20_4_ = fStack_1bec * fStack_1c0c;
          auVar42._16_4_ = fStack_1bf0 * fStack_1c10;
          auVar42._28_4_ = uStack_1be4;
          auVar42._24_4_ = fStack_1be8 * fStack_1c08;
          auVar12 = vsubps_avx(ZEXT832(0),auVar42);
          auVar41._8_8_ = 0x42b0c0a542b0c0a5;
          auVar41._0_8_ = 0x42b0c0a542b0c0a5;
          auVar41._16_8_ = 0x42b0c0a542b0c0a5;
          auVar41._24_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar12,auVar41);
          auVar40._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar40._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar40._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar40);
          local_15e0 = auVar11._0_4_;
          fStack_15dc = auVar11._4_4_;
          fStack_15d8 = auVar11._8_4_;
          fStack_15d4 = auVar11._12_4_;
          fStack_15d0 = auVar11._16_4_;
          fStack_15cc = auVar11._20_4_;
          fStack_15c8 = auVar11._24_4_;
          local_1960._4_4_ = fStack_15dc * 1.442695 + 0.5;
          local_1960._0_4_ = local_15e0 * 1.442695 + 0.5;
          fStack_1958 = fStack_15d8 * 1.442695 + 0.5;
          fStack_1954 = fStack_15d4 * 1.442695 + 0.5;
          fStack_1950 = fStack_15d0 * 1.442695 + 0.5;
          fStack_194c = fStack_15cc * 1.442695 + 0.5;
          fStack_1948 = fStack_15c8 * 1.442695 + 0.5;
          uStack_1944 = 0x3ff8aa3b;
          auVar14 = vroundps_avx(_local_1960,1);
          auVar12 = vcmpps_avx(_local_1960,auVar14,1);
          auVar45._8_8_ = 0x3f8000003f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar45._16_8_ = 0x3f8000003f800000;
          auVar45._24_8_ = 0x3f8000003f800000;
          auVar12 = vandps_avx(auVar12,auVar45);
          auVar12 = vsubps_avx(auVar14,auVar12);
          local_1160 = auVar12._0_4_;
          fStack_115c = auVar12._4_4_;
          fStack_1158 = auVar12._8_4_;
          fStack_1154 = auVar12._12_4_;
          fStack_1150 = auVar12._16_4_;
          fStack_114c = auVar12._20_4_;
          fStack_1148 = auVar12._24_4_;
          fStack_1144 = auVar12._28_4_;
          auVar47._4_4_ = fStack_115c * 0.6933594;
          auVar47._0_4_ = local_1160 * 0.6933594;
          auVar47._8_4_ = fStack_1158 * 0.6933594;
          auVar47._12_4_ = fStack_1154 * 0.6933594;
          auVar47._16_4_ = fStack_1150 * 0.6933594;
          auVar47._20_4_ = fStack_114c * 0.6933594;
          auVar47._24_4_ = fStack_1148 * 0.6933594;
          auVar47._28_4_ = fStack_1144;
          auVar12 = vsubps_avx(auVar11,auVar47);
          auVar46._4_4_ = fStack_115c * -0.00021219444;
          auVar46._0_4_ = local_1160 * -0.00021219444;
          auVar46._8_4_ = fStack_1158 * -0.00021219444;
          auVar46._12_4_ = fStack_1154 * -0.00021219444;
          auVar46._16_4_ = fStack_1150 * -0.00021219444;
          auVar46._20_4_ = fStack_114c * -0.00021219444;
          auVar46._24_4_ = fStack_1148 * -0.00021219444;
          auVar46._28_4_ = fStack_1144;
          auVar12 = vsubps_avx(auVar12,auVar46);
          local_13e0 = auVar12._0_4_;
          fStack_13dc = auVar12._4_4_;
          fStack_13d8 = auVar12._8_4_;
          fStack_13d4 = auVar12._12_4_;
          fStack_13d0 = auVar12._16_4_;
          fStack_13cc = auVar12._20_4_;
          fStack_13c8 = auVar12._24_4_;
          fStack_13c4 = auVar12._28_4_;
          local_1980 = CONCAT44((int)fStack_115c,(int)local_1160);
          uStack_1978 = CONCAT44((int)fStack_1154,(int)fStack_1158);
          uStack_1970 = CONCAT44((int)fStack_114c,(int)fStack_1150);
          uStack_1968 = CONCAT44((int)fStack_1144,(int)fStack_1148);
          auVar49._8_8_ = uStack_1978;
          auVar49._0_8_ = local_1980;
          auVar48._8_8_ = 0x7f0000007f;
          auVar48._0_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx(auVar49,auVar48);
          auVar10._8_8_ = uStack_1968;
          auVar10._0_8_ = uStack_1970;
          auVar9._8_8_ = 0x7f0000007f;
          auVar9._0_8_ = 0x7f0000007f;
          auVar9 = vpaddd_avx(auVar10,auVar9);
          auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
          auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
          local_1440 = auVar8._0_4_;
          fStack_143c = auVar8._4_4_;
          fStack_1438 = auVar8._8_4_;
          fStack_1434 = auVar8._12_4_;
          fStack_1430 = auVar9._0_4_;
          fStack_142c = auVar9._4_4_;
          fStack_1428 = auVar9._8_4_;
          local_1b40 = auVar6._0_4_;
          fStack_1b3c = auVar6._4_4_;
          fStack_1b38 = auVar6._8_4_;
          fStack_1b34 = auVar6._12_4_;
          fStack_1b30 = auVar7._0_4_;
          fStack_1b2c = auVar7._4_4_;
          fStack_1b28 = auVar7._8_4_;
          fStack_1b24 = auVar7._12_4_;
          auVar39._16_8_ = uStack_1af0;
          auVar39._0_16_ = auVar6;
          auVar39._24_8_ = uStack_1ae8;
          auVar38._4_4_ =
               fStack_1b3c +
               ((((((fStack_13dc * 0.00019875691 + 0.0013981999) * fStack_13dc + 0.008333452) *
                   fStack_13dc + 0.041665796) * fStack_13dc + 0.16666666) * fStack_13dc + 0.5) *
                fStack_13dc * fStack_13dc + fStack_13dc + 1.0) * fStack_143c;
          auVar38._0_4_ =
               local_1b40 +
               ((((((local_13e0 * 0.00019875691 + 0.0013981999) * local_13e0 + 0.008333452) *
                   local_13e0 + 0.041665796) * local_13e0 + 0.16666666) * local_13e0 + 0.5) *
                local_13e0 * local_13e0 + local_13e0 + 1.0) * local_1440;
          auVar38._8_4_ =
               fStack_1b38 +
               ((((((fStack_13d8 * 0.00019875691 + 0.0013981999) * fStack_13d8 + 0.008333452) *
                   fStack_13d8 + 0.041665796) * fStack_13d8 + 0.16666666) * fStack_13d8 + 0.5) *
                fStack_13d8 * fStack_13d8 + fStack_13d8 + 1.0) * fStack_1438;
          auVar38._12_4_ =
               fStack_1b34 +
               ((((((fStack_13d4 * 0.00019875691 + 0.0013981999) * fStack_13d4 + 0.008333452) *
                   fStack_13d4 + 0.041665796) * fStack_13d4 + 0.16666666) * fStack_13d4 + 0.5) *
                fStack_13d4 * fStack_13d4 + fStack_13d4 + 1.0) * fStack_1434;
          auVar38._16_4_ =
               fStack_1b30 +
               ((((((fStack_13d0 * 0.00019875691 + 0.0013981999) * fStack_13d0 + 0.008333452) *
                   fStack_13d0 + 0.041665796) * fStack_13d0 + 0.16666666) * fStack_13d0 + 0.5) *
                fStack_13d0 * fStack_13d0 + fStack_13d0 + 1.0) * fStack_1430;
          auVar38._20_4_ =
               fStack_1b2c +
               ((((((fStack_13cc * 0.00019875691 + 0.0013981999) * fStack_13cc + 0.008333452) *
                   fStack_13cc + 0.041665796) * fStack_13cc + 0.16666666) * fStack_13cc + 0.5) *
                fStack_13cc * fStack_13cc + fStack_13cc + 1.0) * fStack_142c;
          auVar38._24_4_ =
               fStack_1b28 +
               ((((((fStack_13c8 * 0.00019875691 + 0.0013981999) * fStack_13c8 + 0.008333452) *
                   fStack_13c8 + 0.041665796) * fStack_13c8 + 0.16666666) * fStack_13c8 + 0.5) *
                fStack_13c8 * fStack_13c8 + fStack_13c8 + 1.0) * fStack_1428;
          auVar38._28_4_ = fStack_1b24 + fStack_13c4 + fStack_13c4 + 1.0;
          auVar12 = vdivps_avx(auVar39,auVar38);
          local_1c40 = auVar12._0_4_;
          fStack_1c3c = auVar12._4_4_;
          fStack_1c38 = auVar12._8_4_;
          fStack_1c34 = auVar12._12_4_;
          fStack_1c30 = auVar12._16_4_;
          fStack_1c2c = auVar12._20_4_;
          fStack_1c28 = auVar12._24_4_;
          auVar44._4_4_ = fStack_1c3c * fStack_1c1c;
          auVar44._0_4_ = local_1c40 * local_1c20;
          auVar44._8_4_ = fStack_1c38 * fStack_1c18;
          auVar44._12_4_ = fStack_1c34 * fStack_1c14;
          auVar44._16_4_ = fStack_1c30 * fStack_1c10;
          auVar44._20_4_ = fStack_1c2c * fStack_1c0c;
          auVar44._24_4_ = fStack_1c28 * fStack_1c08;
          auVar44._28_4_ = auVar12._28_4_;
          auVar43._16_8_ = uStack_1ab0;
          auVar43._0_16_ = auVar5;
          auVar43._24_8_ = uStack_1aa8;
          auVar12 = vsubps_avx(auVar44,auVar43);
          uStack_37c4 = (undefined4)((ulong)uStack_4168 >> 0x20);
          local_3800 = auVar12._0_4_;
          fStack_37fc = auVar12._4_4_;
          fStack_37f8 = auVar12._8_4_;
          fStack_37f4 = auVar12._12_4_;
          fStack_37f0 = auVar12._16_4_;
          fStack_37ec = auVar12._20_4_;
          fStack_37e8 = auVar12._24_4_;
          local_3ca0._4_4_ = fStack_37dc * fStack_37fc;
          local_3ca0._0_4_ = local_37e0 * local_3800;
          uStack_3c98._0_4_ = fStack_37d8 * fStack_37f8;
          uStack_3c98._4_4_ = fStack_37d4 * fStack_37f4;
          uStack_3c90._0_4_ = fStack_37d0 * fStack_37f0;
          uStack_3c90._4_4_ = fStack_37cc * fStack_37ec;
          uStack_3c88._0_4_ = fStack_37c8 * fStack_37e8;
          uStack_3c88._4_4_ = uStack_37c4;
          break;
        case 6:
          uVar1 = *(uint *)*plVar15;
          auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
          auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
          auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
          uVar1 = *(uint *)(*plVar15 + 4);
          auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
          auVar8 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar1),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar1),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
          auVar10 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x30);
          uStack_3570 = auVar10._0_8_;
          uStack_3568 = auVar10._8_8_;
          local_36a0 = auVar5._0_4_;
          fStack_369c = auVar5._4_4_;
          fStack_3698 = auVar5._8_4_;
          fStack_3694 = auVar5._12_4_;
          fStack_3690 = auVar6._0_4_;
          fStack_368c = auVar6._4_4_;
          fStack_3688 = auVar6._8_4_;
          fStack_3684 = auVar6._12_4_;
          local_36e0 = auVar7._0_4_;
          fStack_36dc = auVar7._4_4_;
          fStack_36d8 = auVar7._8_4_;
          fStack_36d4 = auVar7._12_4_;
          fStack_36d0 = auVar8._0_4_;
          fStack_36cc = auVar8._4_4_;
          fStack_36c8 = auVar8._8_4_;
          fStack_36c4 = auVar8._12_4_;
          local_3780._4_4_ = fStack_37dc * fStack_369c + fStack_36dc;
          local_3780._0_4_ = local_37e0 * local_36a0 + local_36e0;
          fStack_3778 = fStack_37d8 * fStack_3698 + fStack_36d8;
          fStack_3774 = fStack_37d4 * fStack_3694 + fStack_36d4;
          uStack_3770._0_4_ = fStack_37d0 * fStack_3690 + fStack_36d0;
          uStack_3770._4_4_ = fStack_37cc * fStack_368c + fStack_36cc;
          uStack_3768._0_4_ = fStack_37c8 * fStack_3688 + fStack_36c8;
          uStack_3768._4_4_ = fStack_3684 + fStack_36c4;
          auVar12 = _local_3780;
          uStack_3768 = auVar12._24_8_;
          auVar12._16_8_ = uStack_3770;
          auVar12._0_16_ = _local_3780;
          auVar12._24_8_ = uStack_3768;
          auVar12 = vmaxps_avx(auVar12,ZEXT832(0));
          auVar11._16_8_ = uStack_3570;
          auVar11._0_16_ = auVar9;
          auVar11._24_8_ = uStack_3568;
          auVar12 = vminps_avx(auVar12,auVar11);
          local_3640 = auVar12._0_4_;
          fStack_363c = auVar12._4_4_;
          fStack_3638 = auVar12._8_4_;
          fStack_3634 = auVar12._12_4_;
          fStack_3630 = auVar12._16_4_;
          fStack_362c = auVar12._20_4_;
          fStack_3628 = auVar12._24_4_;
          uStack_3624 = auVar12._28_4_;
          local_3ca0._4_4_ = fStack_363c * fStack_37dc;
          local_3ca0._0_4_ = local_3640 * local_37e0;
          uStack_3c98._0_4_ = fStack_3638 * fStack_37d8;
          uStack_3c98._4_4_ = fStack_3634 * fStack_37d4;
          uStack_3c90._0_4_ = fStack_3630 * fStack_37d0;
          uStack_3c90._4_4_ = fStack_362c * fStack_37cc;
          uStack_3c88._0_4_ = fStack_3628 * fStack_37c8;
          uStack_3c88._4_4_ = uStack_3624;
          break;
        default:
          uStack_3c98 = uStack_4178;
          local_3ca0 = (undefined1  [8])local_4180;
          uStack_3c90 = uStack_4170;
          uStack_3c88 = uStack_4168;
        }
        *local_40d8 = _local_3ca0;
        local_40d8 = local_40d8 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack1to8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _sum = _mm256_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm256_loadu_ps(bias_data_ptr + p * 8);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        const float* sptr = m.row(sy);

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            float val = sptr[sx];

                            int k = y * kernel_w + x;

                            __m256 _val = _mm256_set1_ps(val);
                            __m256 _w = _mm256_load_ps(kptr + k * 8);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 8;
                }

                _sum = activation_avx(_sum, activation_type, activation_params);

                _mm256_storeu_ps(outptr, _sum);
                outptr += 8;
            }
        }
    }
}